

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformInt
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program,string *name)

{
  deUint32 dVar1;
  GLchar *name_00;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  MessageBuilder local_1a8;
  GLint local_28;
  GLint local_24;
  GLint intVar;
  GLint intLoc;
  string *name_local;
  ShaderProgram *program_local;
  ProgramBinaryUniformResetCase *this_local;
  
  _intVar = name;
  name_local = (string *)program;
  program_local = (ShaderProgram *)this;
  dVar1 = glu::ShaderProgram::getProgram(program);
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  local_24 = glu::CallLogWrapper::glGetUniformLocation
                       (&(this->super_ProgramBinaryCase).super_CallLogWrapper,dVar1,name_00);
  local_28 = -1;
  dVar1 = glu::ShaderProgram::getProgram((ShaderProgram *)name_local);
  glu::CallLogWrapper::glGetUniformiv
            (&(this->super_ProgramBinaryCase).super_CallLogWrapper,dVar1,local_24,&local_28);
  if (local_28 != 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [31])"Fail, expected zero value for ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,_intVar);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])", received: ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_28);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Uniform value not reset");
  }
  return;
}

Assistant:

void verifyUniformInt (glu::ShaderProgram& program, const std::string& name)
	{
		const GLint		intLoc	= glGetUniformLocation(program.getProgram(), name.c_str());
		GLint			intVar	= -1;

		glGetUniformiv(program.getProgram(), intLoc, &intVar);

		if (intVar != 0)
		{
			m_testCtx.getLog() << TestLog::Message << "Fail, expected zero value for " << name << ", received: " << intVar << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Uniform value not reset");
		}
	}